

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

uint8_t duckdb::Node::GetAllocatorIdx(NType type)

{
  uint uVar1;
  InternalException *this;
  allocator local_59;
  string local_58;
  string local_38;
  
  uVar1 = type - 1;
  if (((byte)uVar1 < 10) && ((0x3bfU >> (uVar1 & 0x1f) & 1) != 0)) {
    return (&DAT_0201b9a7)[uVar1 & 0xff];
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Invalid node type for GetAllocatorIdx: %s.",&local_59);
  EnumUtil::ToString<duckdb::NType>(&local_58,type);
  InternalException::InternalException<std::__cxx11::string>(this,&local_38,&local_58);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

uint8_t Node::GetAllocatorIdx(const NType type) {
	switch (type) {
	case NType::PREFIX:
		return 0;
	case NType::LEAF:
		return 1;
	case NType::NODE_4:
		return 2;
	case NType::NODE_16:
		return 3;
	case NType::NODE_48:
		return 4;
	case NType::NODE_256:
		return 5;
	case NType::NODE_7_LEAF:
		return 6;
	case NType::NODE_15_LEAF:
		return 7;
	case NType::NODE_256_LEAF:
		return 8;
	default:
		throw InternalException("Invalid node type for GetAllocatorIdx: %s.", EnumUtil::ToString(type));
	}
}